

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZElementMatrixT.cpp
# Opt level: O3

void __thiscall
TPZElementMatrixT<std::complex<double>_>::ApplyConstraints
          (TPZElementMatrixT<std::complex<double>_> *this)

{
  TPZStack<long,_10> *this_00;
  list<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_> *plVar1;
  TPZBlock *this_01;
  double dVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  long *plVar6;
  complex<double> *pcVar7;
  TNode *pTVar8;
  long lVar9;
  long lVar10;
  double dVar11;
  undefined8 uVar12;
  double dVar13;
  int iVar14;
  _Self __tmp;
  _Base_ptr p_Var15;
  TPZConnect *pTVar16;
  complex<double> *pcVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  ulong uVar23;
  uint uVar24;
  ulong uVar25;
  ulong uVar26;
  TPZDepend *pTVar27;
  long lVar28;
  long lVar29;
  _List_node_base *p_Var30;
  long lVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  ulong uVar36;
  set<long,_std::less<long>,_std::allocator<long>_> connectlist;
  TPZVec<int> DependenceOrder;
  set<long,_std::less<long>,_std::allocator<long>_> origlist;
  long local_1a8;
  long local_1a0;
  long local_198;
  long local_168;
  long local_150;
  long local_148;
  int local_124;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_b0;
  TPZVec<int> local_80;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_60;
  
  if ((this->fMat).super_TPZFMatrix<std::complex<double>_>.super_TPZMatrix<std::complex<double>_>.
      super_TPZBaseMatrix.fRow == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"this->fMat not initialized",0x1a);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
    std::ostream::put(-0x58);
    std::ostream::flush();
  }
  this_00 = &(this->super_TPZElementMatrix).fConstrConnect;
  uVar24 = (uint)(this->super_TPZElementMatrix).fConnect.super_TPZManVector<long,_10>.
                 super_TPZVec<long>.fNElements;
  TPZManVector<long,_10>::Resize(&this_00->super_TPZManVector<long,_10>,(long)(int)uVar24);
  if (uVar24 != 0) {
    local_60._M_impl._0_8_ = 0;
    TPZVec<long>::Fill((TPZVec<long> *)this_00,(long *)&local_60,0,-1);
  }
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_b0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_b0._M_impl.super__Rb_tree_header._M_header;
  local_b0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_b0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_b0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_b0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_b0._M_impl.super__Rb_tree_header._M_header._M_left;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (0 < (int)uVar24) {
    uVar25 = (ulong)(uVar24 & 0x7fffffff);
    lVar29 = 0;
    do {
      std::_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>::
      _M_insert_unique<long_const&>
                ((_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>> *)
                 &local_b0,
                 (long *)((long)(this->super_TPZElementMatrix).fConnect.super_TPZManVector<long,_10>
                                .super_TPZVec<long>.fStore + lVar29));
      lVar29 = lVar29 + 8;
      uVar25 = uVar25 - 1;
    } while (uVar25 != 0);
  }
  plVar1 = &(this->super_TPZElementMatrix).fOneRestraints;
  p_Var30 = (this->super_TPZElementMatrix).fOneRestraints.
            super__List_base<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>._M_impl.
            _M_node.super__List_node_base._M_next;
  if (p_Var30 != (_List_node_base *)plVar1) {
    do {
      if (0 < (long)p_Var30[2]._M_next) {
        lVar29 = 0;
        lVar33 = 0;
        do {
          std::_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>::
          _M_insert_unique<long_const&>
                    ((_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>
                      *)&local_b0,(long *)((long)&(p_Var30[1]._M_prev)->_M_next + lVar29));
          lVar33 = lVar33 + 1;
          lVar29 = lVar29 + 0x10;
        } while (lVar33 < (long)p_Var30[2]._M_next);
      }
      p_Var30 = p_Var30->_M_next;
    } while (p_Var30 != (_List_node_base *)plVar1);
  }
  std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::operator=
            (&local_60,&local_b0);
  TPZConnect::BuildConnectList
            ((set<long,_std::less<long>,_std::allocator<long>_> *)&local_b0,
             (set<long,_std::less<long>,_std::allocator<long>_> *)&local_60,
             (this->super_TPZElementMatrix).fMesh);
  (*(this_00->super_TPZManVector<long,_10>).super_TPZVec<long>._vptr_TPZVec[3])
            (this_00,local_b0._M_impl.super__Rb_tree_header._M_node_count);
  if (local_b0._M_impl.super__Rb_tree_header._M_node_count != 0) {
    plVar6 = (this->super_TPZElementMatrix).fConstrConnect.super_TPZManVector<long,_10>.
             super_TPZVec<long>.fStore;
    uVar25 = 0;
    p_Var15 = local_b0._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      plVar6[uVar25] = *(long *)(p_Var15 + 1);
      p_Var15 = (_Base_ptr)std::_Rb_tree_increment(p_Var15);
      uVar25 = uVar25 + 1;
    } while (uVar25 < local_b0._M_impl.super__Rb_tree_header._M_node_count);
  }
  uVar25 = (this->super_TPZElementMatrix).fConstrConnect.super_TPZManVector<long,_10>.
           super_TPZVec<long>.fNElements;
  local_80._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
  local_80.fStore = (int *)0x0;
  local_80.fNElements = 0;
  local_80.fNAlloc = 0;
  TPZElementMatrix::BuildDependencyOrder
            (&this->super_TPZElementMatrix,(TPZVec<long> *)this_00,&local_80,
             (this->super_TPZElementMatrix).fMesh);
  this_01 = &this->fConstrBlock;
  uVar24 = (uint)uVar25;
  TPZBlock::SetNBlocks(this_01,uVar24);
  if ((int)uVar24 < 1) {
    local_198 = 0;
  }
  else {
    uVar26 = 0;
    local_198 = 0;
    do {
      pTVar16 = TPZChunkVector<TPZConnect,_10>::operator[]
                          (&(((this->super_TPZElementMatrix).fMesh)->fConnectVec).
                            super_TPZChunkVector<TPZConnect,_10>,
                           (this->super_TPZElementMatrix).fConstrConnect.
                           super_TPZManVector<long,_10>.super_TPZVec<long>.fStore[uVar26]);
      iVar14 = TPZConnect::NDof(pTVar16,(this->super_TPZElementMatrix).fMesh);
      if (iVar14 != (uint)(pTVar16->field_2).fCompose.fNState * pTVar16->fNShape) {
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/TPZElementMatrixT.cpp"
                   ,0xbb);
      }
      TPZBlock::Set(this_01,(int)uVar26,iVar14,-1);
      local_198 = local_198 + iVar14;
      uVar26 = uVar26 + 1;
    } while ((uVar24 & 0x7fffffff) != uVar26);
  }
  TPZBlock::Resequence(this_01,0);
  (this->fConstrBlock).fpMatrix = (TPZBaseMatrix *)&this->fConstrMat;
  lVar29 = (this->fMat).super_TPZFMatrix<std::complex<double>_>.
           super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol;
  lVar33 = (this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.
           super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol *
           (this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.
           super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow;
  if ((this->super_TPZElementMatrix).fType == EK) {
    uVar26 = local_198 * local_198;
    lVar34 = local_198;
    if (uVar26 - lVar33 != 0) {
      pcVar7 = (this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.fElem;
      pcVar17 = (this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.fGiven;
      if (pcVar7 != pcVar17 && pcVar7 != (complex<double> *)0x0) {
        operator_delete__(pcVar7);
        pcVar17 = (this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.fGiven;
      }
      if ((pcVar17 == (complex<double> *)0x0) ||
         (lVar33 = (this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.fSize,
         uVar26 - lVar33 != 0 && lVar33 <= (long)uVar26)) {
        if (uVar26 == 0) {
          pcVar17 = (complex<double> *)0x0;
        }
        else {
          pcVar17 = (complex<double> *)operator_new__(-(ulong)(uVar26 >> 0x3c != 0) | uVar26 * 0x10)
          ;
          memset(pcVar17,0,uVar26 * 0x10);
        }
      }
      (this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.fElem = pcVar17;
    }
  }
  else {
    uVar26 = lVar29 * local_198;
    lVar34 = lVar29;
    if (uVar26 - lVar33 != 0) {
      pcVar7 = (this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.fElem;
      pcVar17 = (this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.fGiven;
      if (pcVar7 != pcVar17 && pcVar7 != (complex<double> *)0x0) {
        operator_delete__(pcVar7);
        pcVar17 = (this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.fGiven;
      }
      if ((pcVar17 == (complex<double> *)0x0) ||
         (lVar33 = (this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.fSize,
         uVar26 - lVar33 != 0 && lVar33 <= (long)uVar26)) {
        if (uVar26 == 0) {
          pcVar17 = (complex<double> *)0x0;
        }
        else {
          pcVar17 = (complex<double> *)operator_new__(-(ulong)(uVar26 >> 0x3c != 0) | uVar26 * 0x10)
          ;
          memset(pcVar17,0,uVar26 * 0x10);
        }
      }
      (this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.fElem = pcVar17;
    }
  }
  (this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.super_TPZMatrix<std::complex<double>_>.
  super_TPZBaseMatrix.fRow = local_198;
  (this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.super_TPZMatrix<std::complex<double>_>.
  super_TPZBaseMatrix.fCol = lVar34;
  (*(this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.
    super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
    [0xf])();
  uVar26 = (this->super_TPZElementMatrix).fConnect.super_TPZManVector<long,_10>.super_TPZVec<long>.
           fNElements;
  if (0 < (int)uVar26) {
    uVar26 = uVar26 & 0x7fffffff;
    uVar23 = 0;
    do {
      if ((int)uVar24 < 1) {
        uVar36 = 0;
      }
      else {
        uVar18 = 0;
        do {
          uVar36 = uVar18;
          if ((this->super_TPZElementMatrix).fConstrConnect.super_TPZManVector<long,_10>.
              super_TPZVec<long>.fStore[uVar18] ==
              (this->super_TPZElementMatrix).fConnect.super_TPZManVector<long,_10>.
              super_TPZVec<long>.fStore[uVar23]) break;
          uVar18 = uVar18 + 1;
          uVar36 = uVar25 & 0xffffffff;
        } while ((uVar25 & 0x7fffffff) != uVar18);
        uVar36 = uVar36 & 0xffffffff;
      }
      pTVar8 = (this->fBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore;
      local_1a8 = (long)pTVar8[uVar23].pos;
      iVar14 = pTVar8[uVar23].dim;
      lVar33 = iVar14 + local_1a8;
      local_148 = (long)(this->fConstrBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore[uVar36].pos
      ;
      if ((this->super_TPZElementMatrix).fType == EF) {
        if (0 < iVar14) {
          do {
            if (0 < lVar29) {
              lVar34 = 0;
              do {
                if (((local_1a8 < 0) ||
                    (lVar21 = (this->fMat).super_TPZFMatrix<std::complex<double>_>.
                              super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow,
                    lVar21 <= local_1a8)) ||
                   ((this->fMat).super_TPZFMatrix<std::complex<double>_>.
                    super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol <= lVar34)) {
                  TPZFMatrix<std::complex<double>_>::Error
                            ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                if (((local_148 < 0) ||
                    (lVar22 = (this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.
                              super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow,
                    lVar22 <= local_148)) ||
                   ((this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.
                    super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol <= lVar34)) {
                  TPZFMatrix<std::complex<double>_>::Error
                            ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                pcVar17 = (this->fMat).super_TPZFMatrix<std::complex<double>_>.fElem +
                          lVar21 * lVar34 + local_1a8;
                uVar12 = *(undefined8 *)(pcVar17->_M_value + 8);
                pcVar7 = (this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.fElem +
                         lVar22 * lVar34 + local_148;
                *(undefined8 *)pcVar7->_M_value = *(undefined8 *)pcVar17->_M_value;
                *(undefined8 *)(pcVar7->_M_value + 8) = uVar12;
                lVar34 = lVar34 + 1;
              } while (lVar29 != lVar34);
            }
            local_1a8 = local_1a8 + 1;
            local_148 = local_148 + 1;
          } while (local_1a8 < lVar33);
        }
      }
      else {
        uVar36 = 0;
        do {
          if ((int)uVar24 < 1) {
            uVar18 = 0;
LAB_0115a2d5:
            if ((uint)uVar18 == uVar24) goto LAB_0115a2da;
          }
          else {
            uVar18 = 0;
            do {
              if ((this->super_TPZElementMatrix).fConstrConnect.super_TPZManVector<long,_10>.
                  super_TPZVec<long>.fStore[uVar18] ==
                  (this->super_TPZElementMatrix).fConnect.super_TPZManVector<long,_10>.
                  super_TPZVec<long>.fStore[uVar36]) goto LAB_0115a2d5;
              uVar18 = uVar18 + 1;
            } while ((uVar25 & 0x7fffffff) != uVar18);
            uVar18 = uVar25 & 0xffffffff;
LAB_0115a2da:
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"node not found in node list",0x1b);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
            std::ostream::put(-0x58);
            std::ostream::flush();
          }
          if (0 < iVar14) {
            pTVar8 = (this->fBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore;
            lVar22 = (long)pTVar8[uVar36].pos;
            iVar4 = pTVar8[uVar36].dim;
            iVar5 = (this->fConstrBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore
                    [uVar18 & 0xffffffff].pos;
            lVar34 = local_1a8;
            lVar21 = local_148;
            do {
              lVar19 = (long)iVar5;
              lVar20 = lVar22;
              if (0 < iVar4) {
                do {
                  lVar31 = (this->fMat).super_TPZFMatrix<std::complex<double>_>.
                           super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow;
                  if (((lVar31 <= lVar34 || lVar34 < 0) || (lVar20 < 0)) ||
                     ((this->fMat).super_TPZFMatrix<std::complex<double>_>.
                      super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol <= lVar20)) {
                    TPZFMatrix<std::complex<double>_>::Error
                              ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                    pzinternal::DebugStopImpl
                              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                               ,0x26d);
                  }
                  lVar32 = (this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.
                           super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow;
                  if (((lVar32 <= lVar21 || lVar21 < 0) || (lVar19 < 0)) ||
                     ((this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.
                      super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol <= lVar19)) {
                    TPZFMatrix<std::complex<double>_>::Error
                              ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                    pzinternal::DebugStopImpl
                              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                               ,0x26d);
                  }
                  pcVar17 = (this->fMat).super_TPZFMatrix<std::complex<double>_>.fElem +
                            lVar31 * lVar20 + lVar34;
                  uVar12 = *(undefined8 *)(pcVar17->_M_value + 8);
                  pcVar7 = (this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.fElem +
                           lVar32 * lVar19 + lVar21;
                  *(undefined8 *)pcVar7->_M_value = *(undefined8 *)pcVar17->_M_value;
                  *(undefined8 *)(pcVar7->_M_value + 8) = uVar12;
                  lVar20 = lVar20 + 1;
                  lVar19 = lVar19 + 1;
                } while (lVar20 < iVar4 + lVar22);
              }
              lVar34 = lVar34 + 1;
              lVar21 = lVar21 + 1;
            } while (lVar34 < lVar33);
          }
          uVar36 = uVar36 + 1;
        } while (uVar36 != uVar26);
      }
      uVar23 = uVar23 + 1;
    } while (uVar23 != uVar26);
  }
  if (0 < (int)uVar24) {
    iVar14 = 0;
    local_124 = 0;
    do {
      uVar26 = 0;
      do {
        pTVar16 = TPZChunkVector<TPZConnect,_10>::operator[]
                            (&(((this->super_TPZElementMatrix).fMesh)->fConnectVec).
                              super_TPZChunkVector<TPZConnect,_10>,
                             (this->super_TPZElementMatrix).fConstrConnect.
                             super_TPZManVector<long,_10>.super_TPZVec<long>.fStore[uVar26]);
        if (local_80.fStore[uVar26] == iVar14) {
          pTVar27 = pTVar16->fDependList;
          if (pTVar27 != (TPZDepend *)0x0) {
            pTVar8 = (this->fConstrBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore;
            lVar33 = (long)pTVar8[uVar26].pos;
            iVar4 = pTVar8[uVar26].dim;
            do {
              uVar23 = 0;
              do {
                uVar36 = uVar23;
                if ((this->super_TPZElementMatrix).fConstrConnect.super_TPZManVector<long,_10>.
                    super_TPZVec<long>.fStore[uVar36] == pTVar27->fDepConnectIndex) {
                  if (uVar24 != (uint)uVar36) goto LAB_0115a62f;
                  break;
                }
                uVar23 = uVar36 + 1;
                uVar36 = uVar25 & 0xffffffff;
              } while ((uVar24 & 0x7fffffff) != uVar23);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"node not found in node list",0x1b);
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
              std::ostream::put(-0x58);
              std::ostream::flush();
LAB_0115a62f:
              if (0 < iVar4) {
                pTVar8 = (this->fConstrBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore;
                lVar21 = (long)pTVar8[uVar36 & 0xffffffff].pos;
                iVar5 = pTVar8[uVar36 & 0xffffffff].dim;
                bVar3 = (pTVar16->field_2).fCompose.fNState;
                uVar23 = (ulong)bVar3;
                lVar34 = (ulong)bVar3 * 0x10;
                local_168 = lVar33;
                local_150 = lVar33 << 4;
                do {
                  if (0 < iVar5) {
                    lVar19 = (local_168 - lVar33) / (long)uVar23;
                    lVar22 = lVar21;
                    local_1a0 = lVar21 << 4;
                    do {
                      lVar20 = (lVar22 - lVar21) / (long)uVar23;
                      if (((lVar19 < 0) ||
                          (lVar31 = (pTVar27->fDepMatrix).super_TPZFMatrix<double>.
                                    super_TPZMatrix<double>.super_TPZBaseMatrix.fRow,
                          lVar31 <= lVar19)) ||
                         ((lVar20 < 0 ||
                          ((pTVar27->fDepMatrix).super_TPZFMatrix<double>.super_TPZMatrix<double>.
                           super_TPZBaseMatrix.fCol <= lVar20)))) {
                        TPZFMatrix<double>::Error
                                  ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                        pzinternal::DebugStopImpl
                                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                                   ,0x26d);
                      }
                      dVar2 = (pTVar27->fDepMatrix).super_TPZFMatrix<double>.fElem
                              [lVar31 * lVar20 + lVar19];
                      if ((this->super_TPZElementMatrix).fType == EK) {
                        if (0 < local_198) {
                          lVar31 = 0;
                          lVar20 = 0;
                          do {
                            if (uVar23 != 0) {
                              lVar28 = 0;
                              lVar32 = lVar22;
                              lVar35 = local_168;
                              do {
                                lVar9 = (this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.
                                        super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.
                                        fRow;
                                lVar10 = (this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.
                                         super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.
                                         fCol;
                                if ((lVar10 <= lVar20 || lVar9 <= lVar35) || lVar35 < 0) {
                                  TPZFMatrix<std::complex<double>_>::Error
                                            ("TPZFMatrix<TVar>::operator() "," Index out of bounds")
                                  ;
                                  pzinternal::DebugStopImpl
                                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                                             ,0x26d);
                                }
                                pcVar7 = (this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.
                                         fElem;
                                dVar13 = *(double *)
                                          ((long)(pcVar7->_M_value +
                                                 lVar28 + lVar31 * lVar9 + local_150) + 8);
                                if (((lVar32 < 0) || (lVar9 <= lVar32)) || (lVar10 <= lVar20)) {
                                  TPZFMatrix<std::complex<double>_>::Error
                                            ("TPZFMatrix<TVar>::operator() "," Index out of bounds")
                                  ;
                                  pzinternal::DebugStopImpl
                                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                                             ,0x26d);
                                }
                                dVar11 = *(double *)
                                          ((long)(pcVar7[lVar9 * lVar20]._M_value +
                                                 lVar28 + local_1a0) + 8);
                                *(double *)(pcVar7[lVar9 * lVar20]._M_value + lVar28 + local_1a0) =
                                     *(double *)
                                      (pcVar7[lVar9 * lVar20]._M_value + lVar28 + local_1a0) +
                                     *(double *)
                                      (pcVar7->_M_value + lVar28 + lVar31 * lVar9 + local_150) *
                                     dVar2;
                                *(double *)
                                 ((long)(pcVar7[lVar9 * lVar20]._M_value + lVar28 + local_1a0) + 8)
                                     = dVar11 + dVar13 * dVar2;
                                lVar28 = lVar28 + 0x10;
                                lVar32 = lVar32 + 1;
                                lVar35 = lVar35 + 1;
                              } while (lVar34 != lVar28);
                            }
                            lVar20 = lVar20 + 1;
                            lVar31 = lVar31 + 0x10;
                          } while (lVar20 != local_198);
                        }
                      }
                      else if (0 < lVar29) {
                        lVar31 = 0;
                        lVar20 = 0;
                        do {
                          if (uVar23 != 0) {
                            uVar36 = 0;
                            lVar32 = local_150;
                            lVar35 = local_1a0;
                            do {
                              lVar28 = (this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.
                                       super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.
                                       fRow;
                              lVar9 = (this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.
                                      super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.
                                      fCol;
                              if ((lVar9 <= lVar20 || lVar28 <= (long)(local_168 + uVar36)) ||
                                  (long)(local_168 + uVar36) < 0) {
                                TPZFMatrix<std::complex<double>_>::Error
                                          ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                                pzinternal::DebugStopImpl
                                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                                           ,0x26d);
                              }
                              pcVar7 = (this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.
                                       fElem;
                              dVar13 = *(double *)
                                        ((long)(pcVar7->_M_value + lVar32 + lVar31 * lVar28) + 8);
                              if ((((long)(lVar22 + uVar36) < 0) ||
                                  (lVar28 <= (long)(lVar22 + uVar36))) || (lVar9 <= lVar20)) {
                                TPZFMatrix<std::complex<double>_>::Error
                                          ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                                pzinternal::DebugStopImpl
                                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                                           ,0x26d);
                              }
                              dVar11 = *(double *)
                                        ((long)(pcVar7[lVar28 * lVar20]._M_value + lVar35) + 8);
                              *(double *)(pcVar7[lVar28 * lVar20]._M_value + lVar35) =
                                   *(double *)(pcVar7[lVar28 * lVar20]._M_value + lVar35) +
                                   *(double *)(pcVar7->_M_value + lVar32 + lVar31 * lVar28) * dVar2;
                              *(double *)((long)(pcVar7[lVar28 * lVar20]._M_value + lVar35) + 8) =
                                   dVar11 + dVar13 * dVar2;
                              uVar36 = uVar36 + 1;
                              lVar35 = lVar35 + 0x10;
                              lVar32 = lVar32 + 0x10;
                            } while (uVar23 != uVar36);
                          }
                          lVar20 = lVar20 + 1;
                          lVar31 = lVar31 + 0x10;
                        } while (lVar20 != lVar29);
                      }
                      lVar22 = lVar22 + uVar23;
                      local_1a0 = local_1a0 + lVar34;
                    } while (lVar22 < iVar5 + lVar21);
                  }
                  local_168 = local_168 + uVar23;
                  local_150 = local_150 + lVar34;
                } while (local_168 < iVar4 + lVar33);
                local_1a0 = lVar33;
                if ((this->super_TPZElementMatrix).fType == EK && 0 < iVar4) {
                  do {
                    if (0 < iVar5) {
                      lVar22 = (local_1a0 - lVar33) / (long)uVar23;
                      lVar34 = lVar21;
                      do {
                        lVar19 = (lVar34 - lVar21) / (long)uVar23;
                        if (((lVar22 < 0) ||
                            (lVar20 = (pTVar27->fDepMatrix).super_TPZFMatrix<double>.
                                      super_TPZMatrix<double>.super_TPZBaseMatrix.fRow,
                            lVar20 <= lVar22)) ||
                           ((lVar19 < 0 ||
                            ((pTVar27->fDepMatrix).super_TPZFMatrix<double>.super_TPZMatrix<double>.
                             super_TPZBaseMatrix.fCol <= lVar19)))) {
                          TPZFMatrix<double>::Error
                                    ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                          pzinternal::DebugStopImpl
                                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                                     ,0x26d);
                        }
                        if (0 < local_198) {
                          dVar2 = (pTVar27->fDepMatrix).super_TPZFMatrix<double>.fElem
                                  [lVar20 * lVar19 + lVar22];
                          lVar19 = 0;
                          do {
                            if (bVar3 != 0) {
                              uVar36 = 0;
                              do {
                                lVar20 = local_1a0 + uVar36;
                                lVar31 = (this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.
                                         super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.
                                         fRow;
                                if (((lVar31 <= lVar19) || (lVar20 < 0)) ||
                                   ((this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.
                                    super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol
                                    <= lVar20)) {
                                  TPZFMatrix<std::complex<double>_>::Error
                                            ("TPZFMatrix<TVar>::operator() "," Index out of bounds")
                                  ;
                                  pzinternal::DebugStopImpl
                                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                                             ,0x26d);
                                }
                                pcVar7 = (this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.
                                         fElem;
                                dVar13 = *(double *)(pcVar7[lVar20 * lVar31 + lVar19]._M_value + 8);
                                lVar32 = uVar36 + lVar34;
                                if (((lVar31 <= lVar19) || (lVar32 < 0)) ||
                                   ((this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.
                                    super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol
                                    <= lVar32)) {
                                  TPZFMatrix<std::complex<double>_>::Error
                                            ("TPZFMatrix<TVar>::operator() "," Index out of bounds")
                                  ;
                                  pzinternal::DebugStopImpl
                                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                                             ,0x26d);
                                }
                                dVar11 = *(double *)(pcVar7[lVar31 * lVar32 + lVar19]._M_value + 8);
                                *(double *)pcVar7[lVar31 * lVar32 + lVar19]._M_value =
                                     *(double *)pcVar7[lVar31 * lVar32 + lVar19]._M_value +
                                     *(double *)pcVar7[lVar20 * lVar31 + lVar19]._M_value * dVar2;
                                *(double *)(pcVar7[lVar31 * lVar32 + lVar19]._M_value + 8) =
                                     dVar11 + dVar13 * dVar2;
                                uVar36 = uVar36 + 1;
                              } while (uVar23 != uVar36);
                            }
                            lVar19 = lVar19 + 1;
                          } while (lVar19 != local_198);
                        }
                        lVar34 = lVar34 + uVar23;
                      } while (lVar34 < iVar5 + lVar21);
                    }
                    local_1a0 = local_1a0 + uVar23;
                  } while (local_1a0 < iVar4 + lVar33);
                }
              }
              pTVar27 = pTVar27->fNext;
            } while (pTVar27 != (TPZDepend *)0x0);
          }
          local_124 = local_124 + 1;
          if ((this->super_TPZElementMatrix).fOneRestraints.
              super__List_base<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>._M_impl.
              _M_node._M_size != 0) {
            (*(this->super_TPZElementMatrix)._vptr_TPZElementMatrix[7])(this,uVar26 & 0xffffffff);
          }
        }
        uVar26 = uVar26 + 1;
      } while (uVar26 != (uVar24 & 0x7fffffff));
      iVar14 = iVar14 + 1;
    } while (local_124 < (int)uVar24);
  }
  local_80._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
  if (local_80.fStore != (int *)0x0) {
    operator_delete__(local_80.fStore);
  }
  std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::~_Rb_tree
            (&local_b0);
  std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::~_Rb_tree
            (&local_60);
  return;
}

Assistant:

void TPZElementMatrixT<TVar>::ApplyConstraints(){
	
	if (this->fMat.Rows() == 0){
		LOGPZ_FATAL(logger, "this->fMat not initialized");
	}
	
	int totalnodes= this->NConnects();
	this->fConstrConnect.Resize(totalnodes);
	if(totalnodes) this->fConstrConnect.Fill(0,0);
	int in;
    std::set<int64_t> origlist,connectlist;
	for(in=0; in<totalnodes; in++) connectlist.insert(this->fConnect[in]);
    for (std::list<TPZOneShapeRestraint>::iterator it = fOneRestraints.begin(); it != fOneRestraints.end(); it++) {
        for (int c=0; c< it->fFaces.size(); c++) {
            connectlist.insert(it->fFaces[c].first);
        }
    }
    origlist = connectlist;
	// total number of nodes of the constrained element
	TPZConnect::BuildConnectList(connectlist, origlist, *this->fMesh);
    this->fConstrConnect.resize(connectlist.size());
    std::set<int64_t>::iterator it = connectlist.begin();
    for (int64_t i=0; i<connectlist.size(); i++) {
        fConstrConnect[i] = *it;
        it++;
    }
	totalnodes = this->fConstrConnect.NElements();
	
	// compute the list of nodes and their proper order of processing
	TPZVec<int> DependenceOrder;
	// this->fConstrNod, totalnodes and DependenceOrder
	// are initialized using codes documented above
	BuildDependencyOrder(this->fConstrConnect,DependenceOrder,*this->fMesh);
	
	// compute the number of statevariables
	// the number of state variables is the number of unknowns associated with
	// each shapefunction
	// numstate is best initialized during computation of the stiffness matrix
	//   TPZMaterial * mat = Material();
	//   int numstate = mat->NStateVariables();
	
	// initialize the block structure
	this->fConstrBlock.SetNBlocks(totalnodes);
	
	// toteq contains the total number of equations of the constrained matrix
	int64_t toteq = 0;
	for(in=0; in<totalnodes; in++) {
		int64_t dfnindex = this->fConstrConnect[in];
		TPZConnect &dfn = fMesh->ConnectVec()[dfnindex];
		int ndf = dfn.NDof(*fMesh);
        int ndfcheck = dfn.NState()*dfn.NShape();
        if(ndf != ndfcheck)
        {
            DebugStop();
        }
		this->fConstrBlock.Set(in,ndf);
		toteq += ndf;
	}
	
	this->fConstrBlock.Resequence();
	this->fConstrBlock.SetMatrix(&this->fConstrMat);
	    
	int64_t nrhs = this->fMat.Cols();
	if (this->fType == TPZElementMatrix::EK){
		this->fConstrMat.Redim(toteq,toteq);
	}
	else{
		this->fConstrMat.Redim(toteq,nrhs);
	}
	
	// copy the original matrix to the constrained matrix
	int numnod = this->fConnect.NElements();
	for(in=0; in<numnod; in++) {
		int irnode =0;
		int64_t idfn = this->fConnect[in];
		// find the index of the node in the destination (constrained) matrix
		while(irnode < totalnodes && this->fConstrConnect[irnode] != idfn) irnode++;
		
		// first and last rows in the original matrix
		int64_t ifirst = this->fBlock.Position(in);
		int64_t ilast = ifirst+this->fBlock.Size(in);
		
		// first and last rows in the desination (reception) matrix
		int64_t irfirst = this->fConstrBlock.Position(irnode);
		//	   int irlast = irfirst+this->fConstrBlock->Size(irnode);
		
		int64_t i,ir,ieq;
		if (this->fType == TPZElementMatrix::EF){
			for(i=ifirst,ir=irfirst;i<ilast;i++,ir++) {
				for(ieq=0; ieq<nrhs; ieq++) {
					(this->fConstrMat)(ir,ieq) = (this->fMat)(i,ieq);
				}
			}
		}
		else{
			int jn;
			for(jn=0; jn<numnod; jn++) {
				int jrnode = 0;
				int64_t jdfn = this->fConnect[jn];
				// find the index of the node in the destination (constrained) matrix
				while(jrnode < totalnodes && this->fConstrConnect[jrnode] != jdfn) jrnode++;
				if(jrnode == totalnodes) {
					LOGPZ_ERROR(logger, "node not found in node list");
				}
				// first and last columns in the original matrix
				int64_t jfirst = this->fBlock.Position(jn);
				int64_t jlast = jfirst+this->fBlock.Size(jn);
				// first and last columns in the desination (reception) matrix
				int64_t jrfirst = this->fConstrBlock.Position(jrnode);
				//int jrlast = irfirst+this->fConstrBlock->Size(jrnode);
				int64_t j,jr;
				for(i=ifirst,ir=irfirst;i<ilast; i++,ir++) {
					for(j=jfirst,jr=jrfirst;j<jlast; j++,jr++) {
						(this->fConstrMat)(ir,jr) = (this->fMat)(i,j);
					}
				}
			}
		}//else
	}
	
	int numnodes_processed = 0;
	int current_order = 0;
	while(numnodes_processed < totalnodes) {
		int in;
		for(in=0; in<totalnodes; in++) {
			int64_t dfnindex = this->fConstrConnect[in];
			TPZConnect *dfn = &(fMesh->ConnectVec()[dfnindex]);
			if(DependenceOrder[in] != current_order) continue;
			
			// only nodes which have dependency order equal to the
			// current order are processed
			numnodes_processed++;
			
			int64_t inpos = this->fConstrBlock.Position(in);
			int64_t insize = this->fConstrBlock.Size(in);
			// inpos : position of the dependent equation
			// insize : number of equations processed
			
			// loop over the nodes from which dfn depends
			TPZConnect::TPZDepend *dep = dfn->FirstDepend();
			while(dep) {
				int64_t depnodeindex = dep->fDepConnectIndex;
				// look for the index where depnode is found
				int depindex=0;
				while(depindex < totalnodes && this->fConstrConnect[depindex] != depnodeindex) depindex++;
				if(depindex == totalnodes) {
					LOGPZ_ERROR(logger,"node not found in node list");
				}
				
				int64_t deppos = this->fConstrBlock.Position(depindex);
				int64_t depsize = this->fConstrBlock.Size(depindex);
				// deppos : position of the receiving equation
				// depsize : number of receiving equations
				
				// process the rows of the constrained matrix
				int64_t send;
				int64_t receive;
				int ieq;
				STATE coef;
				int idf;
				int numstate = dfn->NState();
				for(send=inpos; send<inpos+insize; send += numstate) {
					for(receive=deppos; receive<deppos+depsize; receive += numstate) {
						coef = dep->fDepMatrix((send-inpos)/numstate,(receive-deppos)/numstate);
						if (this->fType == TPZElementMatrix::EK){
							for(ieq=0; ieq<toteq; ieq++) for(idf=0; idf<numstate; idf++)  {
								(this->fConstrMat)(receive+idf,ieq) += coef*(this->fConstrMat)(send+idf,ieq);
							}
						}//EK
						else{
							for(ieq=0; ieq<nrhs; ieq++) for(idf=0; idf<numstate; idf++) {
								(this->fConstrMat)(receive+idf,ieq) += coef*(this->fConstrMat)(send+idf,ieq);
							}
						}//EF
					}
				}
				
				if (this->fType == TPZElementMatrix::EK){
					for(send=inpos; send<inpos+insize; send += numstate) {
						for(receive=deppos; receive<deppos+depsize; receive += numstate) {
							coef = dep->fDepMatrix((send-inpos)/numstate,(receive-deppos)/numstate);
							for(ieq=0; ieq<toteq; ieq++) for(idf=0; idf<numstate; idf++) {
								(this->fConstrMat)(ieq,receive+idf) += coef*(this->fConstrMat)(ieq,send+idf);
							}
						}
					}
				}//EK
				
				dep = dep->fNext;
			} // end of while
            
            /// check whether the connect has a one shape restraint
            if (fOneRestraints.size())
            {
                ApplyOneShapeConstraints(in);
            }
            
            
		} // end of loop over all nodes
		current_order++;
	} // end of while loop
}